

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSetPropertyCommand.cxx
# Opt level: O1

string * SetPropertyCommand::MakeSourceFilePathAbsoluteIfNeeded
                   (string *__return_storage_ptr__,cmExecutionStatus *status,
                   string *source_file_path,bool needed)

{
  pointer pcVar1;
  string *in_base;
  undefined3 in_register_00000009;
  
  if (CONCAT31(in_register_00000009,needed) == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar1 = (source_file_path->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar1,pcVar1 + source_file_path->_M_string_length);
  }
  else {
    in_base = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(status->Makefile);
    cmsys::SystemTools::CollapseFullPath(__return_storage_ptr__,source_file_path,in_base);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string MakeSourceFilePathAbsoluteIfNeeded(
  cmExecutionStatus& status, const std::string& source_file_path,
  const bool needed)
{
  if (!needed) {
    return source_file_path;
  }
  std::string absolute_file_path = cmSystemTools::CollapseFullPath(
    source_file_path, status.GetMakefile().GetCurrentSourceDirectory());
  return absolute_file_path;
}